

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O3

Wln_Ntk_t * Wln_NtkAlloc(char *pName,int nObjsMax)

{
  size_t __size;
  uint uVar1;
  Wln_Ntk_t *pWVar2;
  char *pcVar3;
  int *piVar4;
  Wln_Vec_t *pWVar5;
  Hash_IntMan_t *p;
  Vec_Int_t *pVVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  pWVar2 = (Wln_Ntk_t *)calloc(1,0x458);
  if (pName == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = Extra_FileNameGeneric(pName);
  }
  pWVar2->pName = pcVar3;
  piVar4 = (int *)malloc(0x1bc);
  (pWVar2->vCis).pArray = piVar4;
  if (piVar4 != (int *)0x0) {
    (pWVar2->vCis).nCap = 0x6f;
    piVar4 = (int *)malloc(0x1bc);
    (pWVar2->vCos).pArray = piVar4;
    if (piVar4 != (int *)0x0) {
      (pWVar2->vCos).nCap = 0x6f;
      piVar4 = (int *)malloc(0x1bc);
      (pWVar2->vFfs).pArray = piVar4;
      if (piVar4 != (int *)0x0) {
        (pWVar2->vFfs).nCap = 0x6f;
        uVar10 = nObjsMax + 1;
        if (nObjsMax < 0) {
LAB_00386d69:
          Vec_IntPush(&pWVar2->vTypes,-1);
          uVar9 = (pWVar2->vSigns).nSize;
          if (uVar9 == (pWVar2->vSigns).nCap) {
            if ((int)uVar9 < 0x10) {
              pcVar3 = (pWVar2->vSigns).pArray;
              if (pcVar3 == (char *)0x0) {
                pcVar3 = (char *)malloc(0x10);
              }
              else {
                pcVar3 = (char *)realloc(pcVar3,0x10);
              }
              (pWVar2->vSigns).pArray = pcVar3;
              (pWVar2->vSigns).nCap = 0x10;
            }
            else {
              __size = (ulong)uVar9 * 2;
              pcVar3 = (pWVar2->vSigns).pArray;
              if (pcVar3 == (char *)0x0) {
                pcVar3 = (char *)malloc(__size);
              }
              else {
                pcVar3 = (char *)realloc(pcVar3,__size);
              }
              (pWVar2->vSigns).pArray = pcVar3;
              (pWVar2->vSigns).nCap = (int)__size;
            }
          }
          else {
            pcVar3 = (pWVar2->vSigns).pArray;
          }
          (pWVar2->vSigns).nSize = uVar9 + 1;
          pcVar3[(int)uVar9] = -1;
          Vec_IntPush(&pWVar2->vRanges,-1);
          pWVar5 = (Wln_Vec_t *)calloc((long)(int)uVar10,0x10);
          pWVar2->vFanins = pWVar5;
          p = (Hash_IntMan_t *)calloc(1,0x18);
          uVar10 = 1099;
          while( true ) {
            do {
              uVar9 = uVar10;
              uVar10 = uVar9 + 1;
            } while ((uVar9 & 1) != 0);
            if (uVar10 < 9) break;
            iVar7 = 5;
            while (uVar10 % (iVar7 - 2U) != 0) {
              uVar1 = iVar7 * iVar7;
              iVar7 = iVar7 + 2;
              if (uVar10 < uVar1) goto LAB_00386e79;
            }
          }
LAB_00386e79:
          pVVar6 = (Vec_Int_t *)malloc(0x10);
          uVar8 = 0x10;
          if (0xe < uVar9) {
            uVar8 = (ulong)uVar10;
          }
          pVVar6->nCap = (int)uVar8;
          piVar4 = (int *)malloc((long)(int)uVar8 << 2);
          pVVar6->pArray = piVar4;
          pVVar6->nSize = uVar10;
          if (piVar4 != (int *)0x0) {
            memset(piVar4,0,(long)(int)uVar10 << 2);
          }
          p->vTable = pVVar6;
          pVVar6 = (Vec_Int_t *)malloc(0x10);
          pVVar6->nCap = 0x1130;
          piVar4 = (int *)malloc(0x44c0);
          pVVar6->pArray = piVar4;
          p->vObjs = pVVar6;
          piVar4[0] = 0;
          piVar4[1] = 0;
          piVar4[2] = 0;
          piVar4[3] = 0;
          pVVar6->nSize = 4;
          p->nRefs = 1;
          pWVar2->pRanges = p;
          iVar7 = 0;
          do {
            Hash_Int2ManInsert(p,iVar7,iVar7,(int)uVar8);
            iVar7 = iVar7 + 1;
          } while (iVar7 != 0x41);
          iVar7 = 1;
          do {
            Hash_Int2ManInsert(p,iVar7,0,(int)uVar8);
            iVar7 = iVar7 + 1;
          } while (iVar7 != 0x40);
          if ((p->vObjs->nSize & 0xfffffffcU) != 0x204) {
            __assert_fail("Hash_IntManEntryNum(p->pRanges) == 128",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wln/wlnNtk.c"
                          ,0x41,"Wln_Ntk_t *Wln_NtkAlloc(char *, int)");
          }
          return pWVar2;
        }
        uVar8 = (ulong)uVar10;
        piVar4 = (int *)malloc(uVar8 * 4);
        (pWVar2->vTypes).pArray = piVar4;
        if (piVar4 != (int *)0x0) {
          (pWVar2->vTypes).nCap = uVar10;
          pcVar3 = (char *)malloc(uVar8);
          (pWVar2->vSigns).pArray = pcVar3;
          (pWVar2->vSigns).nCap = uVar10;
          piVar4 = (int *)malloc(uVar8 << 2);
          (pWVar2->vRanges).pArray = piVar4;
          if (piVar4 != (int *)0x0) {
            (pWVar2->vRanges).nCap = uVar10;
            goto LAB_00386d69;
          }
        }
      }
    }
  }
  __assert_fail("p->pArray",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creating networks.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Wln_Ntk_t * Wln_NtkAlloc( char * pName, int nObjsMax )
{
    Wln_Ntk_t * p; int i;
    p = ABC_CALLOC( Wln_Ntk_t, 1 );
    p->pName = pName ? Extra_FileNameGeneric( pName ) : NULL;
    Vec_IntGrow( &p->vCis, 111 );
    Vec_IntGrow( &p->vCos, 111 );
    Vec_IntGrow( &p->vFfs, 111 );
    Vec_IntGrow( &p->vTypes,  nObjsMax+1 );
    Vec_StrGrow( &p->vSigns,  nObjsMax+1 );
    Vec_IntGrow( &p->vRanges, nObjsMax+1 );
    Vec_IntPush( &p->vTypes,  -1 );
    Vec_StrPush( &p->vSigns,  -1 );
    Vec_IntPush( &p->vRanges, -1 );
    p->vFanins = ABC_CALLOC( Wln_Vec_t, nObjsMax+1 );
    p->pRanges = Hash_IntManStart( 1000 );
    for ( i = 0; i < 65; i++ )
        Hash_Int2ManInsert( p->pRanges, i, i, 0 );
    for ( i = 1; i < 64; i++ )
        Hash_Int2ManInsert( p->pRanges, i, 0, 0 );
    assert( Hash_IntManEntryNum(p->pRanges) == 128 );
    return p;
}